

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void raviV_op_concat(lua_State *L,CallInfo *ci,int a,int b,int c)

{
  int iVar1;
  StkId pTVar2;
  StkId local_60;
  TValue *io2;
  TValue *io1;
  StkId base;
  StkId ra;
  StkId rb;
  int c_local;
  int b_local;
  int a_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  L->top = (ci->u).l.base + (long)c + 1;
  luaV_concat(L,(c - b) + 1);
  local_60 = (ci->u).l.base;
  pTVar2 = local_60 + a;
  local_60 = local_60 + b;
  pTVar2->value_ = local_60->value_;
  pTVar2->tt_ = local_60->tt_;
  if ((pTVar2->tt_ & 0x8000) != 0) {
    if ((pTVar2->tt_ & 0x8000) == 0) {
      __assert_fail("(((io1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb71,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
    }
    if ((pTVar2->tt_ & 0x7f) != (ushort)((pTVar2->value_).gc)->tt) {
LAB_0015e959:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb71,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
    }
    if (L != (lua_State *)0x0) {
      if ((pTVar2->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xb71,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
      }
      if ((((pTVar2->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0) goto LAB_0015e959;
    }
  }
  if (0 < L->l_G->GCdebt) {
    if (local_60 <= pTVar2) {
      local_60 = pTVar2 + 1;
    }
    L->top = local_60;
    luaC_step(L);
    L->top = ci->top;
  }
  iVar1 = **(int **)&L[-1].hookmask + -1;
  **(int **)&L[-1].hookmask = iVar1;
  if (iVar1 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xb72,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
  }
  iVar1 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xb72,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
  }
  L->top = ci->top;
  return;
}

Assistant:

void raviV_op_concat(lua_State *L, CallInfo *ci, int a, int b, int c) {
  StkId rb, ra;
  StkId base = ci->u.l.base;
  L->top = base + c + 1; /* mark the end of concat operands */
  Protect_base(luaV_concat(L, c - b + 1));
  ra = base + a; /* 'luav_concat' may invoke TMs and move the stack */
  rb = base + b;
  setobjs2s(L, ra, rb);
  checkGC_protectbase(L, (ra >= rb ? ra + 1 : rb));
  L->top = ci->top; /* restore top */
}